

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_dec.c
# Opt level: O3

int VP8ParseIntraModeRow(VP8BitReader *br,VP8Decoder *dec)

{
  uint8_t *puVar1;
  byte bVar2;
  VP8MBData *pVVar3;
  ulong *puVar4;
  uint uVar5;
  byte bVar6;
  int *piVar7;
  ulong uVar8;
  uint8_t *puVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  range_t rVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  uint8_t uVar18;
  long lVar19;
  uint uVar20;
  uint uVar21;
  
  if (0 < dec->mb_w) {
    puVar1 = dec->intra_l;
    lVar14 = 0;
    do {
      piVar7 = (int *)(dec->intra_t + lVar14 * 4);
      pVVar3 = dec->mb_data;
      if ((dec->segment_hdr).update_map == 0) {
        bVar6 = 0;
      }
      else {
        bVar6 = (dec->proba).segments[0];
        rVar13 = br->range;
        iVar10 = br->bits;
        if (iVar10 < 0) {
          puVar4 = (ulong *)br->buf;
          if (puVar4 < br->buf_max) {
            uVar16 = *puVar4;
            br->buf = (uint8_t *)((long)puVar4 + 7);
            br->value = br->value << 0x38 |
                        ((uVar16 & 0xff000000000000) >> 0x28 | (uVar16 & 0xff0000000000) >> 0x18 |
                         (uVar16 & 0xff00000000) >> 8 | (uVar16 & 0xff000000) << 8 |
                         (uVar16 & 0xff0000) << 0x18 | (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38)
                        >> 8;
            iVar10 = iVar10 + 0x38;
          }
          else {
            VP8LoadFinalBytes(br);
            iVar10 = br->bits;
          }
        }
        uVar20 = bVar6 * rVar13 >> 8;
        uVar16 = br->value;
        uVar15 = (uint)(uVar16 >> ((byte)iVar10 & 0x3f));
        if (uVar20 < uVar15) {
          uVar12 = rVar13 - uVar20;
          uVar16 = uVar16 - ((ulong)uVar20 + 1 << ((byte)iVar10 & 0x3f));
          br->value = uVar16;
        }
        else {
          uVar12 = uVar20 + 1;
        }
        uVar21 = 0x1f;
        if (uVar12 != 0) {
          for (; uVar12 >> uVar21 == 0; uVar21 = uVar21 - 1) {
          }
        }
        iVar10 = iVar10 - (uVar21 ^ 7);
        rVar13 = (uVar12 << ((byte)(uVar21 ^ 7) & 0x1f)) - 1;
        br->bits = iVar10;
        br->range = rVar13;
        if (uVar20 < uVar15) {
          bVar6 = (dec->proba).segments[2];
          if (iVar10 < 0) {
            puVar4 = (ulong *)br->buf;
            if (puVar4 < br->buf_max) {
              uVar17 = *puVar4;
              br->buf = (uint8_t *)((long)puVar4 + 7);
              uVar16 = uVar16 << 0x38 |
                       ((uVar17 & 0xff000000000000) >> 0x28 | (uVar17 & 0xff0000000000) >> 0x18 |
                        (uVar17 & 0xff00000000) >> 8 | (uVar17 & 0xff000000) << 8 |
                        (uVar17 & 0xff0000) << 0x18 | (uVar17 & 0xff00) << 0x28 | uVar17 << 0x38) >>
                       8;
              br->value = uVar16;
              iVar10 = iVar10 + 0x38;
            }
            else {
              VP8LoadFinalBytes(br);
              iVar10 = br->bits;
              uVar16 = br->value;
            }
          }
          uVar20 = bVar6 * rVar13 >> 8;
          uVar15 = (uint)(uVar16 >> ((byte)iVar10 & 0x3f));
          if (uVar20 < uVar15) {
            uVar12 = rVar13 - uVar20;
            br->value = uVar16 - ((ulong)uVar20 + 1 << ((byte)iVar10 & 0x3f));
          }
          else {
            uVar12 = uVar20 + 1;
          }
          uVar21 = 0x1f;
          if (uVar12 != 0) {
            for (; uVar12 >> uVar21 == 0; uVar21 = uVar21 - 1) {
            }
          }
          br->bits = iVar10 - (uVar21 ^ 7);
          br->range = (uVar12 << ((byte)(uVar21 ^ 7) & 0x1f)) - 1;
          bVar6 = uVar20 < uVar15 | 2;
        }
        else {
          bVar6 = (dec->proba).segments[1];
          if (iVar10 < 0) {
            puVar4 = (ulong *)br->buf;
            if (puVar4 < br->buf_max) {
              uVar17 = *puVar4;
              br->buf = (uint8_t *)((long)puVar4 + 7);
              uVar16 = uVar16 << 0x38 |
                       ((uVar17 & 0xff000000000000) >> 0x28 | (uVar17 & 0xff0000000000) >> 0x18 |
                        (uVar17 & 0xff00000000) >> 8 | (uVar17 & 0xff000000) << 8 |
                        (uVar17 & 0xff0000) << 0x18 | (uVar17 & 0xff00) << 0x28 | uVar17 << 0x38) >>
                       8;
              br->value = uVar16;
              iVar10 = iVar10 + 0x38;
            }
            else {
              VP8LoadFinalBytes(br);
              iVar10 = br->bits;
              uVar16 = br->value;
            }
          }
          uVar20 = bVar6 * rVar13 >> 8;
          uVar15 = (uint)(uVar16 >> ((byte)iVar10 & 0x3f));
          if (uVar20 < uVar15) {
            uVar12 = rVar13 - uVar20;
            br->value = uVar16 - ((ulong)uVar20 + 1 << ((byte)iVar10 & 0x3f));
          }
          else {
            uVar12 = uVar20 + 1;
          }
          bVar6 = uVar20 < uVar15;
          uVar15 = 0x1f;
          if (uVar12 != 0) {
            for (; uVar12 >> uVar15 == 0; uVar15 = uVar15 - 1) {
            }
          }
          br->bits = iVar10 - (uVar15 ^ 7);
          br->range = (uVar12 << ((byte)(uVar15 ^ 7) & 0x1f)) - 1;
        }
      }
      pVVar3[lVar14].segment = bVar6;
      if (dec->use_skip_proba == 0) {
        rVar13 = br->range;
        iVar10 = br->bits;
      }
      else {
        bVar6 = dec->skip_p;
        rVar13 = br->range;
        iVar10 = br->bits;
        if (iVar10 < 0) {
          puVar4 = (ulong *)br->buf;
          if (puVar4 < br->buf_max) {
            uVar16 = *puVar4;
            br->buf = (uint8_t *)((long)puVar4 + 7);
            br->value = br->value << 0x38 |
                        ((uVar16 & 0xff000000000000) >> 0x28 | (uVar16 & 0xff0000000000) >> 0x18 |
                         (uVar16 & 0xff00000000) >> 8 | (uVar16 & 0xff000000) << 8 |
                         (uVar16 & 0xff0000) << 0x18 | (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38)
                        >> 8;
            iVar10 = iVar10 + 0x38;
          }
          else {
            VP8LoadFinalBytes(br);
            iVar10 = br->bits;
          }
        }
        uVar20 = bVar6 * rVar13 >> 8;
        uVar15 = (uint)(br->value >> ((byte)iVar10 & 0x3f));
        if (uVar20 < uVar15) {
          uVar12 = rVar13 - uVar20;
          br->value = br->value - ((ulong)uVar20 + 1 << ((byte)iVar10 & 0x3f));
        }
        else {
          uVar12 = uVar20 + 1;
        }
        uVar21 = 0x1f;
        if (uVar12 != 0) {
          for (; uVar12 >> uVar21 == 0; uVar21 = uVar21 - 1) {
          }
        }
        iVar10 = iVar10 - (uVar21 ^ 7);
        rVar13 = (uVar12 << ((byte)(uVar21 ^ 7) & 0x1f)) - 1;
        br->bits = iVar10;
        br->range = rVar13;
        pVVar3[lVar14].skip = uVar20 < uVar15;
      }
      if (iVar10 < 0) {
        puVar4 = (ulong *)br->buf;
        if (puVar4 < br->buf_max) {
          uVar16 = *puVar4;
          br->buf = (uint8_t *)((long)puVar4 + 7);
          br->value = br->value << 0x38 |
                      ((uVar16 & 0xff000000000000) >> 0x28 | (uVar16 & 0xff0000000000) >> 0x18 |
                       (uVar16 & 0xff00000000) >> 8 | (uVar16 & 0xff000000) << 8 |
                       (uVar16 & 0xff0000) << 0x18 | (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38) >>
                      8;
          iVar10 = iVar10 + 0x38;
        }
        else {
          VP8LoadFinalBytes(br);
          iVar10 = br->bits;
        }
      }
      uVar15 = rVar13 * 0x91 >> 8;
      uVar20 = (uint)(br->value >> ((byte)iVar10 & 0x3f));
      if (uVar15 < uVar20) {
        uVar12 = rVar13 - uVar15;
        br->value = br->value - ((ulong)uVar15 + 1 << ((byte)iVar10 & 0x3f));
      }
      else {
        uVar12 = uVar15 + 1;
      }
      uVar21 = 0x1f;
      if (uVar12 != 0) {
        for (; uVar12 >> uVar21 == 0; uVar21 = uVar21 - 1) {
        }
      }
      iVar10 = iVar10 - (uVar21 ^ 7);
      rVar13 = (uVar12 << ((byte)(uVar21 ^ 7) & 0x1f)) - 1;
      br->bits = iVar10;
      br->range = rVar13;
      pVVar3[lVar14].is_i4x4 = uVar15 >= uVar20;
      if (uVar15 < uVar20) {
        if (iVar10 < 0) {
          puVar4 = (ulong *)br->buf;
          if (puVar4 < br->buf_max) {
            uVar16 = *puVar4;
            br->buf = (uint8_t *)((long)puVar4 + 7);
            br->value = br->value << 0x38 |
                        ((uVar16 & 0xff000000000000) >> 0x28 | (uVar16 & 0xff0000000000) >> 0x18 |
                         (uVar16 & 0xff00000000) >> 8 | (uVar16 & 0xff000000) << 8 |
                         (uVar16 & 0xff0000) << 0x18 | (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38)
                        >> 8;
            iVar10 = iVar10 + 0x38;
          }
          else {
            VP8LoadFinalBytes(br);
            iVar10 = br->bits;
          }
        }
        uVar15 = rVar13 * 0x9c >> 8;
        uVar16 = br->value;
        uVar20 = (uint)(uVar16 >> ((byte)iVar10 & 0x3f));
        if (uVar15 < uVar20) {
          uVar12 = rVar13 - uVar15;
          uVar16 = uVar16 - ((ulong)uVar15 + 1 << ((byte)iVar10 & 0x3f));
          br->value = uVar16;
        }
        else {
          uVar12 = uVar15 + 1;
        }
        uVar21 = 0x1f;
        if (uVar12 != 0) {
          for (; uVar12 >> uVar21 == 0; uVar21 = uVar21 - 1) {
          }
        }
        iVar10 = iVar10 - (uVar21 ^ 7);
        uVar12 = (uVar12 << ((byte)(uVar21 ^ 7) & 0x1f)) - 1;
        br->bits = iVar10;
        br->range = uVar12;
        if (uVar15 < uVar20) {
          if (iVar10 < 0) {
            puVar4 = (ulong *)br->buf;
            if (puVar4 < br->buf_max) {
              uVar17 = *puVar4;
              br->buf = (uint8_t *)((long)puVar4 + 7);
              uVar16 = uVar16 << 0x38 |
                       ((uVar17 & 0xff000000000000) >> 0x28 | (uVar17 & 0xff0000000000) >> 0x18 |
                        (uVar17 & 0xff00000000) >> 8 | (uVar17 & 0xff000000) << 8 |
                        (uVar17 & 0xff0000) << 0x18 | (uVar17 & 0xff00) << 0x28 | uVar17 << 0x38) >>
                       8;
              br->value = uVar16;
              iVar10 = iVar10 + 0x38;
            }
            else {
              VP8LoadFinalBytes(br);
              iVar10 = br->bits;
              uVar16 = br->value;
            }
          }
          uVar15 = uVar12 >> 1 & 0xffffff;
          if (uVar15 < (uint)(uVar16 >> ((byte)iVar10 & 0x3f))) {
            uVar12 = uVar12 - uVar15;
            br->value = uVar16 - ((ulong)uVar15 + 1 << ((byte)iVar10 & 0x3f));
            bVar6 = 1;
          }
          else {
            bVar6 = 3;
LAB_00125080:
            uVar12 = uVar15 + 1;
          }
        }
        else {
          if (iVar10 < 0) {
            puVar4 = (ulong *)br->buf;
            if (puVar4 < br->buf_max) {
              uVar17 = *puVar4;
              br->buf = (uint8_t *)((long)puVar4 + 7);
              uVar16 = uVar16 << 0x38 |
                       ((uVar17 & 0xff000000000000) >> 0x28 | (uVar17 & 0xff0000000000) >> 0x18 |
                        (uVar17 & 0xff00000000) >> 8 | (uVar17 & 0xff000000) << 8 |
                        (uVar17 & 0xff0000) << 0x18 | (uVar17 & 0xff00) << 0x28 | uVar17 << 0x38) >>
                       8;
              br->value = uVar16;
              iVar10 = iVar10 + 0x38;
            }
            else {
              VP8LoadFinalBytes(br);
              iVar10 = br->bits;
              uVar16 = br->value;
            }
          }
          uVar15 = uVar12 * 0xa3 >> 8;
          if ((uint)(uVar16 >> ((byte)iVar10 & 0x3f)) <= uVar15) {
            bVar6 = 0;
            goto LAB_00125080;
          }
          uVar12 = uVar12 - uVar15;
          br->value = uVar16 - ((ulong)uVar15 + 1 << ((byte)iVar10 & 0x3f));
          bVar6 = 2;
        }
        uVar15 = 0x1f;
        if (uVar12 != 0) {
          for (; uVar12 >> uVar15 == 0; uVar15 = uVar15 - 1) {
          }
        }
        br->bits = iVar10 - (uVar15 ^ 7);
        br->range = (uVar12 << ((byte)(uVar15 ^ 7) & 0x1f)) - 1;
        pVVar3[lVar14].imodes[0] = bVar6;
        *piVar7 = (uint)bVar6 * 0x1010101;
        *(uint *)puVar1 = (uint)bVar6 * 0x1010101;
      }
      else {
        puVar9 = pVVar3[lVar14].imodes;
        lVar11 = 0;
        do {
          uVar16 = (ulong)puVar1[lVar11];
          lVar19 = 0;
          do {
            bVar6 = *(byte *)((long)piVar7 + lVar19);
            bVar2 = kBModesProba[bVar6][uVar16][0];
            rVar13 = br->range;
            iVar10 = br->bits;
            if (iVar10 < 0) {
              puVar4 = (ulong *)br->buf;
              if (puVar4 < br->buf_max) {
                uVar17 = *puVar4;
                br->buf = (uint8_t *)((long)puVar4 + 7);
                br->value = br->value << 0x38 |
                            ((uVar17 & 0xff000000000000) >> 0x28 | (uVar17 & 0xff0000000000) >> 0x18
                             | (uVar17 & 0xff00000000) >> 8 | (uVar17 & 0xff000000) << 8 |
                             (uVar17 & 0xff0000) << 0x18 | (uVar17 & 0xff00) << 0x28 |
                            uVar17 << 0x38) >> 8;
                iVar10 = iVar10 + 0x38;
              }
              else {
                VP8LoadFinalBytes(br);
                iVar10 = br->bits;
              }
            }
            uVar20 = bVar2 * rVar13 >> 8;
            uVar17 = br->value;
            uVar15 = (uint)(uVar17 >> ((byte)iVar10 & 0x3f));
            if (uVar20 < uVar15) {
              uVar12 = rVar13 - uVar20;
              uVar17 = uVar17 - ((ulong)uVar20 + 1 << ((byte)iVar10 & 0x3f));
              br->value = uVar17;
            }
            else {
              uVar12 = uVar20 + 1;
            }
            uVar21 = 0x1f;
            if (uVar12 != 0) {
              for (; uVar12 >> uVar21 == 0; uVar21 = uVar21 - 1) {
              }
            }
            iVar10 = iVar10 - (uVar21 ^ 7);
            br->bits = iVar10;
            rVar13 = (uVar12 << ((byte)(uVar21 ^ 7) & 0x1f)) - 1;
            br->range = rVar13;
            uVar12 = (uint)""[uVar20 < uVar15];
            if ((2U >> (uVar20 < uVar15) & 1) != 0) {
              do {
                bVar2 = kBModesProba[bVar6][uVar16][uVar12];
                if (iVar10 < 0) {
                  puVar4 = (ulong *)br->buf;
                  if (puVar4 < br->buf_max) {
                    uVar8 = *puVar4;
                    br->buf = (uint8_t *)((long)puVar4 + 7);
                    uVar17 = uVar17 << 0x38 |
                             ((uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18
                              | (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 |
                              (uVar8 & 0xff0000) << 0x18 | (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38)
                             >> 8;
                    br->value = uVar17;
                    iVar10 = iVar10 + 0x38;
                  }
                  else {
                    VP8LoadFinalBytes(br);
                    iVar10 = br->bits;
                    uVar17 = br->value;
                  }
                }
                uVar15 = bVar2 * rVar13 >> 8;
                uVar20 = (uint)(uVar17 >> ((byte)iVar10 & 0x3f));
                if (uVar15 < uVar20) {
                  uVar21 = rVar13 - uVar15;
                  uVar17 = uVar17 - ((ulong)uVar15 + 1 << ((byte)iVar10 & 0x3f));
                  br->value = uVar17;
                }
                else {
                  uVar21 = uVar15 + 1;
                }
                uVar5 = uVar12 * 2;
                uVar8 = (ulong)(uVar15 < uVar20);
                uVar15 = 0x1f;
                if (uVar21 != 0) {
                  for (; uVar21 >> uVar15 == 0; uVar15 = uVar15 - 1) {
                  }
                }
                iVar10 = iVar10 - (uVar15 ^ 7);
                br->bits = iVar10;
                rVar13 = (uVar21 << ((byte)(uVar15 ^ 7) & 0x1f)) - 1;
                br->range = rVar13;
                uVar12 = (uint)""[uVar8 | uVar5];
              } while ((0xa2eaUL >> (uVar8 | (ulong)uVar5 & 0x3f) & 1) != 0);
            }
            uVar16 = (ulong)-uVar12;
            uVar18 = (uint8_t)-uVar12;
            *(uint8_t *)((long)piVar7 + lVar19) = uVar18;
            lVar19 = lVar19 + 1;
          } while (lVar19 != 4);
          *(int *)puVar9 = *piVar7;
          puVar9 = puVar9 + 4;
          puVar1[lVar11] = uVar18;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 4);
      }
      rVar13 = br->range;
      iVar10 = br->bits;
      if (iVar10 < 0) {
        puVar4 = (ulong *)br->buf;
        if (puVar4 < br->buf_max) {
          uVar16 = *puVar4;
          br->buf = (uint8_t *)((long)puVar4 + 7);
          br->value = br->value << 0x38 |
                      ((uVar16 & 0xff000000000000) >> 0x28 | (uVar16 & 0xff0000000000) >> 0x18 |
                       (uVar16 & 0xff00000000) >> 8 | (uVar16 & 0xff000000) << 8 |
                       (uVar16 & 0xff0000) << 0x18 | (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38) >>
                      8;
          iVar10 = iVar10 + 0x38;
        }
        else {
          VP8LoadFinalBytes(br);
          iVar10 = br->bits;
        }
      }
      uVar15 = rVar13 * 0x8e >> 8;
      uVar16 = br->value;
      uVar20 = (uint)(uVar16 >> ((byte)iVar10 & 0x3f));
      if (uVar15 < uVar20) {
        uVar12 = rVar13 - uVar15;
        uVar16 = uVar16 - ((ulong)uVar15 + 1 << ((byte)iVar10 & 0x3f));
        br->value = uVar16;
      }
      else {
        uVar12 = uVar15 + 1;
      }
      uVar21 = 0x1f;
      if (uVar12 != 0) {
        for (; uVar12 >> uVar21 == 0; uVar21 = uVar21 - 1) {
        }
      }
      iVar10 = iVar10 - (uVar21 ^ 7);
      rVar13 = (uVar12 << ((byte)(uVar21 ^ 7) & 0x1f)) - 1;
      br->bits = iVar10;
      br->range = rVar13;
      if (uVar15 < uVar20) {
        if (iVar10 < 0) {
          puVar4 = (ulong *)br->buf;
          if (puVar4 < br->buf_max) {
            uVar17 = *puVar4;
            br->buf = (uint8_t *)((long)puVar4 + 7);
            uVar16 = uVar16 << 0x38 |
                     ((uVar17 & 0xff000000000000) >> 0x28 | (uVar17 & 0xff0000000000) >> 0x18 |
                      (uVar17 & 0xff00000000) >> 8 | (uVar17 & 0xff000000) << 8 |
                      (uVar17 & 0xff0000) << 0x18 | (uVar17 & 0xff00) << 0x28 | uVar17 << 0x38) >> 8
            ;
            br->value = uVar16;
            iVar10 = iVar10 + 0x38;
          }
          else {
            VP8LoadFinalBytes(br);
            iVar10 = br->bits;
            uVar16 = br->value;
          }
        }
        uVar15 = rVar13 * 0x72 >> 8;
        uVar20 = (uint)(uVar16 >> ((byte)iVar10 & 0x3f));
        if (uVar15 < uVar20) {
          uVar12 = rVar13 - uVar15;
          uVar16 = uVar16 - ((ulong)uVar15 + 1 << ((byte)iVar10 & 0x3f));
          br->value = uVar16;
        }
        else {
          uVar12 = uVar15 + 1;
        }
        uVar21 = 0x1f;
        if (uVar12 != 0) {
          for (; uVar12 >> uVar21 == 0; uVar21 = uVar21 - 1) {
          }
        }
        iVar10 = iVar10 - (uVar21 ^ 7);
        rVar13 = (uVar12 << ((byte)(uVar21 ^ 7) & 0x1f)) - 1;
        br->bits = iVar10;
        br->range = rVar13;
        uVar18 = '\x02';
        if (uVar15 < uVar20) {
          if (iVar10 < 0) {
            puVar4 = (ulong *)br->buf;
            if (puVar4 < br->buf_max) {
              uVar17 = *puVar4;
              br->buf = (uint8_t *)((long)puVar4 + 7);
              uVar16 = uVar16 << 0x38 |
                       ((uVar17 & 0xff000000000000) >> 0x28 | (uVar17 & 0xff0000000000) >> 0x18 |
                        (uVar17 & 0xff00000000) >> 8 | (uVar17 & 0xff000000) << 8 |
                        (uVar17 & 0xff0000) << 0x18 | (uVar17 & 0xff00) << 0x28 | uVar17 << 0x38) >>
                       8;
              br->value = uVar16;
              iVar10 = iVar10 + 0x38;
            }
            else {
              VP8LoadFinalBytes(br);
              iVar10 = br->bits;
              uVar16 = br->value;
            }
          }
          uVar15 = rVar13 * 0xb7 >> 8;
          if (uVar15 < (uint)(uVar16 >> ((byte)iVar10 & 0x3f))) {
            uVar20 = rVar13 - uVar15;
            br->value = uVar16 - ((ulong)uVar15 + 1 << ((byte)iVar10 & 0x3f));
            uVar18 = '\x01';
          }
          else {
            uVar20 = uVar15 + 1;
            uVar18 = '\x03';
          }
          uVar15 = 0x1f;
          if (uVar20 != 0) {
            for (; uVar20 >> uVar15 == 0; uVar15 = uVar15 - 1) {
            }
          }
          br->bits = iVar10 - (uVar15 ^ 7);
          br->range = (uVar20 << ((byte)(uVar15 ^ 7) & 0x1f)) - 1;
        }
      }
      else {
        uVar18 = '\0';
      }
      pVVar3[lVar14].uvmode = uVar18;
      lVar14 = lVar14 + 1;
    } while (lVar14 < dec->mb_w);
  }
  return (int)((dec->br).eof == 0);
}

Assistant:

int VP8ParseIntraModeRow(VP8BitReader* const br, VP8Decoder* const dec) {
  int mb_x;
  for (mb_x = 0; mb_x < dec->mb_w; ++mb_x) {
    ParseIntraMode(br, dec, mb_x);
  }
  return !dec->br.eof;
}